

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O0

void __thiscall SslTcpSocketImpl::~SslTcpSocketImpl(SslTcpSocketImpl *this)

{
  int iVar1;
  pointer pSVar2;
  SslTcpSocketImpl *this_local;
  
  (this->super_TcpSocketImpl).super_BaseSocketImpl._vptr_BaseSocketImpl =
       (_func_int **)&PTR__SslTcpSocketImpl_001b7d90;
  if (this->m_iSslInit == 1) {
    pSVar2 = std::
             unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             ::operator->(&this->m_pSslCon);
    iVar1 = OpenSSLWrapper::SslConnection::GetShutDownFlag(pSVar2);
    if (iVar1 < 1) {
      pSVar2 = std::
               unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
               ::operator->(&this->m_pSslCon);
      OpenSSLWrapper::SslConnection::SSLSetShutdown(pSVar2,3);
    }
  }
  std::__cxx11::string::~string((string *)&this->m_strTrustRootCert);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->m_vProtoList);
  std::function<void_(TcpSocket_*,_void_*)>::~function(&this->m_fClientConnectedParam);
  std::function<void_(TcpSocket_*)>::~function(&this->m_fClientConnected);
  std::
  unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>::
  ~unique_ptr(&this->m_pSslCon);
  std::vector<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>::
  ~vector(&this->m_pServerCtx);
  OpenSSLWrapper::SslClientContext::~SslClientContext(&this->m_pClientCtx);
  TcpSocketImpl::~TcpSocketImpl(&this->super_TcpSocketImpl);
  return;
}

Assistant:

SslTcpSocketImpl::~SslTcpSocketImpl()
{
    if (m_iSslInit == 1 && m_pSslCon->GetShutDownFlag() < 1)
        m_pSslCon->SSLSetShutdown(SSL_SENT_SHUTDOWN | SSL_RECEIVED_SHUTDOWN);
}